

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

int __thiscall
skiplist<DictKey,_std::less<DictKey>_>::count
          (skiplist<DictKey,_std::less<DictKey>_> *this,DictKey *value)

{
  bool bVar1;
  int local_94;
  iterator local_80;
  DictKey local_58;
  undefined1 local_30 [8];
  iterator it;
  DictKey *value_local;
  skiplist<DictKey,_std::less<DictKey>_> *this_local;
  
  it.node = (SLNode<DictKey> *)value;
  DictKey::DictKey(&local_58,value);
  find((iterator *)local_30,this,&local_58);
  DictKey::~DictKey(&local_58);
  end(&local_80,this);
  bVar1 = cake_iterator<false>::operator!=((cake_iterator<false> *)local_30,&local_80);
  if (bVar1) {
    local_94 = *(int *)(it._8_8_ + 0x60);
  }
  else {
    local_94 = 0;
  }
  return local_94;
}

Assistant:

int count(val_type value) {
        auto it = find(value);
        return  it != end() ? it.node->count : 0;
    }